

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall Centaurus::NFA<unsigned_char>::NFA(NFA<unsigned_char> *this)

{
  CharClass<unsigned_char> local_30;
  
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001b5738;
  std::
  vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ::emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states);
  local_30._vptr_CharClass = (_func_int **)&PTR__CharClass_001b44c0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  add_state(this,&local_30);
  CharClass<unsigned_char>::~CharClass(&local_30);
  return;
}

Assistant:

NFA()
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
    }